

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O1

void SimpleLoggerMgr::handleStackTrace(int sig,siginfo_t *info,void *secret)

{
  int iVar1;
  undefined4 extraout_var;
  pthread_t pVar2;
  undefined4 in_register_0000003c;
  atomic<SimpleLoggerMgr_*> this;
  
  this._M_b._M_p = instance._M_b._M_p;
  if (instance._M_b._M_p == (__pointer_type)0x0) {
    iVar1 = init((EVP_PKEY_CTX *)CONCAT44(in_register_0000003c,sig));
    this._M_b._M_p = (__base_type)CONCAT44(extraout_var,iVar1);
  }
  if ((((__pointer_type)this._M_b._M_p)->crashOriginThread).super___atomic_base<unsigned_long>._M_i
      != 0) {
    pVar2 = pthread_self();
    if ((((__pointer_type)this._M_b._M_p)->crashOriginThread).super___atomic_base<unsigned_long>.
        _M_i != pVar2) {
      addRawStackInfo((SimpleLoggerMgr *)this._M_b._M_p,false);
      pthread_kill((((__pointer_type)this._M_b._M_p)->crashOriginThread).
                   super___atomic_base<unsigned_long>._M_i,0xc);
      return;
    }
  }
  return;
}

Assistant:

void SimpleLogger::setCriticalInfo(const std::string& info_str) {
    SimpleLoggerMgr* mgr = SimpleLoggerMgr::get();
    if (mgr) {
        mgr->setCriticalInfo(info_str);
    }
}